

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O0

int __thiscall CNetServer::Send(CNetServer *this,CNetChunk *pChunk,TOKEN Token)

{
  int iVar1;
  int in_EDX;
  CNetBase *in_RSI;
  CNetServer *in_RDI;
  CSendCBData *in_stack_00000010;
  int in_stack_0000001c;
  void *in_stack_00000020;
  int Flags;
  int i;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CNetConnection *in_stack_ffffffffffffffc8;
  TOKEN in_stack_ffffffffffffffd8;
  TOKEN in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  if ((*(uint *)&in_RSI->field_0x1c & 2) == 0) {
    if (0x56e < *(int *)&in_RSI->m_DataLogSent + 3) {
      dbg_msg("netclient","chunk payload too big. %d. dropping chunk",
              (ulong)*(uint *)&in_RSI->m_DataLogSent);
      return -1;
    }
    dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
                   (char *)0x249747);
    dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
                   (char *)0x24976f);
    CNetConnection::State(&in_RDI->m_aSlots[*(int *)&in_RSI->m_pConfig].m_Connection);
    dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8,
                   (char *)0x2497b5);
    iVar1 = CNetConnection::QueueChunk
                      ((CNetConnection *)in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8,
                       (void *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar1 == 0) {
      if ((*(uint *)&in_RSI->field_0x1c & 4) != 0) {
        CNetConnection::Flush(in_stack_ffffffffffffffc8);
      }
    }
    else {
      Drop(in_RDI,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    }
  }
  else {
    if (0x56e < *(int *)&in_RSI->m_DataLogSent) {
      dbg_msg("netserver","packet payload too big. %d. dropping packet",
              (ulong)*(uint *)&in_RSI->m_DataLogSent);
      return -1;
    }
    if (*(int *)&in_RSI->m_pConfig == -1) {
      for (in_stack_ffffffffffffffe0 = 0; in_stack_ffffffffffffffe0 < 0x40;
          in_stack_ffffffffffffffe0 = in_stack_ffffffffffffffe0 + 1) {
        iVar1 = CNetConnection::State(&in_RDI->m_aSlots[in_stack_ffffffffffffffe0].m_Connection);
        if (iVar1 != 0) {
          in_stack_ffffffffffffffc8 = (CNetConnection *)((long)&in_RSI->m_pConfig + 4);
          CNetConnection::PeerAddress(&in_RDI->m_aSlots[in_stack_ffffffffffffffe0].m_Connection);
          iVar1 = net_addr_comp((NETADDR *)in_stack_ffffffffffffffc8,
                                (NETADDR *)
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
          if (iVar1 == 0) {
            *(int *)&in_RSI->m_pConfig = in_stack_ffffffffffffffe0;
            break;
          }
        }
      }
    }
    iVar1 = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
    if (in_EDX == -1) {
      if (*(int *)&in_RSI->m_pConfig == -1) {
        CNetTokenCache::SendPacketConnless
                  ((CNetTokenCache *)pChunk,(NETADDR *)CONCAT44(Token,i),in_stack_00000020,
                   in_stack_0000001c,in_stack_00000010);
      }
      else {
        dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (int)in_stack_ffffffffffffffb8,(char *)0x249632);
        dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (int)in_stack_ffffffffffffffb8,(char *)0x24965a);
        CNetConnection::State(&in_RDI->m_aSlots[*(int *)&in_RSI->m_pConfig].m_Connection);
        dbg_assert_imp((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (int)in_stack_ffffffffffffffb8,(char *)0x2496a0);
        CNetConnection::SendPacketConnless
                  ((CNetConnection *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   in_stack_ffffffffffffffb8,0);
      }
    }
    else {
      CNetTokenManager::GenerateToken
                ((CNetTokenManager *)CONCAT44(in_EDX,in_stack_ffffffffffffffc0),
                 (NETADDR *)((long)&in_RSI->m_pConfig + 4));
      CNetBase::SendPacketConnless
                (in_RSI,(NETADDR *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,in_RDI,iVar1);
    }
  }
  return 0;
}

Assistant:

int CNetServer::Send(CNetChunk *pChunk, TOKEN Token)
{
	if(pChunk->m_Flags&NETSENDFLAG_CONNLESS)
	{
		if(pChunk->m_DataSize >= NET_MAX_PAYLOAD)
		{
			dbg_msg("netserver", "packet payload too big. %d. dropping packet", pChunk->m_DataSize);
			return -1;
		}

		if(pChunk->m_ClientID == -1)
		{
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(&pChunk->m_Address, m_aSlots[i].m_Connection.PeerAddress(), true) == 0)
				{
					// upgrade the packet, now that we know its recipent
					pChunk->m_ClientID = i;
					break;
				}
			}
		}

		if(Token != NET_TOKEN_NONE)
		{
			SendPacketConnless(&pChunk->m_Address, Token, m_TokenManager.GenerateToken(&pChunk->m_Address), pChunk->m_pData, pChunk->m_DataSize);
		}
		else
		{
			if(pChunk->m_ClientID == -1)
			{
				m_TokenCache.SendPacketConnless(&pChunk->m_Address, pChunk->m_pData, pChunk->m_DataSize);
			}
			else
			{
				dbg_assert(pChunk->m_ClientID >= 0, "errornous client id");
				dbg_assert(pChunk->m_ClientID < NET_MAX_CLIENTS, "errornous client id");
				dbg_assert(m_aSlots[pChunk->m_ClientID].m_Connection.State() != NET_CONNSTATE_OFFLINE, "errornous client id");

				m_aSlots[pChunk->m_ClientID].m_Connection.SendPacketConnless((const char *)pChunk->m_pData, pChunk->m_DataSize);
			}
		}
	}
	else
	{
		if(pChunk->m_DataSize+NET_MAX_CHUNKHEADERSIZE >= NET_MAX_PAYLOAD)
		{
			dbg_msg("netclient", "chunk payload too big. %d. dropping chunk", pChunk->m_DataSize);
			return -1;
		}

		int Flags = 0;
		dbg_assert(pChunk->m_ClientID >= 0, "errornous client id");
		dbg_assert(pChunk->m_ClientID < NET_MAX_CLIENTS, "errornous client id");
		dbg_assert(m_aSlots[pChunk->m_ClientID].m_Connection.State() != NET_CONNSTATE_OFFLINE, "errornous client id");

		if(pChunk->m_Flags&NETSENDFLAG_VITAL)
			Flags = NET_CHUNKFLAG_VITAL;

		if(m_aSlots[pChunk->m_ClientID].m_Connection.QueueChunk(Flags, pChunk->m_DataSize, pChunk->m_pData) == 0)
		{
			if(pChunk->m_Flags&NETSENDFLAG_FLUSH)
				m_aSlots[pChunk->m_ClientID].m_Connection.Flush();
		}
		else
		{
			Drop(pChunk->m_ClientID, "Error sending data");
		}
	}
	return 0;
}